

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* efsw::String::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *str,char *splitchar,bool *pushEmptyString)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  ulong local_58;
  size_t i;
  string tmpstr;
  bool *pushEmptyString_local;
  char *splitchar_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmp;
  
  tmpstr.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&i);
  for (local_58 = 0; uVar1 = std::__cxx11::string::size(), local_58 < uVar1; local_58 = local_58 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar2 == *splitchar) {
      if (((*pushEmptyString & 1U) != 0) || (lVar3 = std::__cxx11::string::size(), lVar3 != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&i);
        std::__cxx11::string::operator=((string *)&i,"");
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
      std::__cxx11::string::operator+=((string *)&i,*pcVar2);
    }
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&i);
  }
  tmpstr.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&i);
  if ((tmpstr.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector < std::string > String::split ( const std::string& str, const char& splitchar, const bool& pushEmptyString )
{
	std::vector < std::string > tmp;
	std::string tmpstr;

	for ( size_t i = 0; i < str.size(); i++ )
	{
		if ( str[i] == splitchar )
		{
			if ( pushEmptyString || tmpstr.size() )
			{
				tmp.push_back(tmpstr);
				tmpstr = "";
			}
		}
		else
		{
			tmpstr += str[i];
		}
	}

	if ( tmpstr.size() )
	{
		tmp.push_back( tmpstr );
	}

	return tmp;
}